

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O2

void __thiscall CGraphics_Threaded::FlushVertices(CGraphics_Threaded *this)

{
  int iVar1;
  undefined8 uVar2;
  undefined4 uVar3;
  bool bVar4;
  uint WantedSize;
  int iVar5;
  char *fmt;
  long in_FS_OFFSET;
  CRenderCommand local_78;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = this->m_NumVertices;
  if (iVar1 == 0) goto LAB_0011e872;
  this->m_NumVertices = 0;
  local_78.super_CCommand.m_Cmd = 7;
  local_78.super_CCommand.m_pNext = (CCommand *)0x0;
  local_78.m_State.m_BlendMode = (this->m_State).m_BlendMode;
  local_78.m_State.m_WrapModeU = (this->m_State).m_WrapModeU;
  local_78.m_State.m_WrapModeV = (this->m_State).m_WrapModeV;
  local_78.m_State.m_Texture = (this->m_State).m_Texture;
  local_78.m_State.m_TextureArrayIndex = (this->m_State).m_TextureArrayIndex;
  local_78.m_State.m_Dimension = (this->m_State).m_Dimension;
  local_78.m_State.m_ScreenTL = (this->m_State).m_ScreenTL;
  local_78.m_State.m_ScreenBR = (this->m_State).m_ScreenBR;
  uVar2._0_1_ = (this->m_State).m_ClipEnable;
  uVar2._1_3_ = *(undefined3 *)&(this->m_State).field_0x29;
  uVar2._4_4_ = (this->m_State).m_ClipX;
  uVar3 = (this->m_State).m_ClipY;
  local_78.m_State.m_ClipW = (this->m_State).m_ClipW;
  local_78.m_State.m_ClipH = (this->m_State).m_ClipH;
  local_78.m_State._40_4_ = SUB84(uVar2,0);
  local_78.m_State.m_ClipX = uVar2._4_4_;
  local_78.m_State.m_ClipY = uVar3;
  if (this->m_Drawing == 1) {
    iVar5 = 4;
    local_78.m_PrimType = 2;
  }
  else {
    if (this->m_Drawing != 2) goto LAB_0011e872;
    iVar5 = 2;
    local_78.m_PrimType = 1;
  }
  local_78.m_PrimCount = iVar1 / iVar5;
  WantedSize = iVar1 * 0x24;
  local_78.m_pVertices = (CVertex *)CCommandBuffer::AllocData(this->m_pCommandBuffer,WantedSize);
  if (local_78.m_pVertices == (CVertex *)0x0) {
    KickCommandBuffer(this);
    local_78.m_pVertices = (CVertex *)CCommandBuffer::AllocData(this->m_pCommandBuffer,WantedSize);
    if (local_78.m_pVertices != (CVertex *)0x0) goto LAB_0011e7f8;
LAB_0011e84d:
    fmt = "failed to allocate data for vertices";
  }
  else {
LAB_0011e7f8:
    bVar4 = CCommandBuffer::AddCommand<CCommandBuffer::CRenderCommand>
                      (this->m_pCommandBuffer,&local_78);
    if (bVar4) {
LAB_0011e835:
      mem_copy(local_78.m_pVertices,this->m_aVertices,WantedSize);
      goto LAB_0011e872;
    }
    KickCommandBuffer(this);
    local_78.m_pVertices = (CVertex *)CCommandBuffer::AllocData(this->m_pCommandBuffer,WantedSize);
    if (local_78.m_pVertices == (CVertex *)0x0) goto LAB_0011e84d;
    bVar4 = CCommandBuffer::AddCommand<CCommandBuffer::CRenderCommand>
                      (this->m_pCommandBuffer,&local_78);
    if (bVar4) goto LAB_0011e835;
    fmt = "failed to allocate memory for render command";
  }
  dbg_msg("graphics",fmt);
LAB_0011e872:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGraphics_Threaded::FlushVertices()
{
	if(m_NumVertices == 0)
		return;

	int NumVerts = m_NumVertices;
	m_NumVertices = 0;

	CCommandBuffer::CRenderCommand Cmd;
	Cmd.m_State = m_State;

	if(m_Drawing == DRAWING_QUADS)
	{
		Cmd.m_PrimType = CCommandBuffer::PRIMTYPE_QUADS;
		Cmd.m_PrimCount = NumVerts/4;
	}
	else if(m_Drawing == DRAWING_LINES)
	{
		Cmd.m_PrimType = CCommandBuffer::PRIMTYPE_LINES;
		Cmd.m_PrimCount = NumVerts/2;
	}
	else
		return;

	Cmd.m_pVertices = (CCommandBuffer::CVertex *)m_pCommandBuffer->AllocData(sizeof(CCommandBuffer::CVertex)*NumVerts);
	if(Cmd.m_pVertices == 0x0)
	{
		// kick command buffer and try again
		KickCommandBuffer();

		Cmd.m_pVertices = (CCommandBuffer::CVertex *)m_pCommandBuffer->AllocData(sizeof(CCommandBuffer::CVertex)*NumVerts);
		if(Cmd.m_pVertices == 0x0)
		{
			dbg_msg("graphics", "failed to allocate data for vertices");
			return;
		}
	}

	// check if we have enough free memory in the commandbuffer
	if(!m_pCommandBuffer->AddCommand(Cmd))
	{
		// kick command buffer and try again
		KickCommandBuffer();

		Cmd.m_pVertices = (CCommandBuffer::CVertex *)m_pCommandBuffer->AllocData(sizeof(CCommandBuffer::CVertex)*NumVerts);
		if(Cmd.m_pVertices == 0x0)
		{
			dbg_msg("graphics", "failed to allocate data for vertices");
			return;
		}

		if(!m_pCommandBuffer->AddCommand(Cmd))
		{
			dbg_msg("graphics", "failed to allocate memory for render command");
			return;
		}
	}

	mem_copy(Cmd.m_pVertices, m_aVertices, sizeof(CCommandBuffer::CVertex)*NumVerts);
}